

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

pointer __thiscall
slang::SmallVectorBase<slang::ast::CoverageOptionSetter>::
emplaceRealloc<slang::ast::Scope_const&,slang::syntax::CoverageOptionSyntax_const&>
          (SmallVectorBase<slang::ast::CoverageOptionSetter> *this,pointer pos,Scope *args,
          CoverageOptionSyntax *args_1)

{
  ulong uVar1;
  undefined8 *puVar2;
  CoverageOptionSyntax *pCVar3;
  pointer pCVar4;
  pointer pCVar5;
  size_type sVar6;
  pointer pCVar7;
  long lVar8;
  ulong capacity;
  
  if (this->len == 0x7fffffffffffffff) {
    detail::throwLengthError();
  }
  capacity = this->len + 1;
  uVar1 = this->cap;
  if (capacity < uVar1 * 2) {
    capacity = uVar1 * 2;
  }
  if (0x7fffffffffffffff - uVar1 < uVar1) {
    capacity = 0x7fffffffffffffff;
  }
  lVar8 = (long)pos - (long)this->data_;
  pCVar4 = (pointer)detail::allocArray(capacity,0x18);
  *(Scope **)((long)pCVar4 + lVar8) = args;
  *(CoverageOptionSyntax **)((long)pCVar4 + lVar8 + 8) = args_1;
  *(undefined8 *)((long)pCVar4 + lVar8 + 0x10) = 0;
  pCVar5 = this->data_;
  sVar6 = this->len;
  if (pCVar5 + sVar6 == pos) {
    pCVar7 = pCVar4;
    if (sVar6 != 0) {
      do {
        pCVar7->expr = pCVar5->expr;
        pCVar3 = (pCVar5->syntax).ptr;
        (pCVar7->scope).ptr = (pCVar5->scope).ptr;
        (pCVar7->syntax).ptr = pCVar3;
        pCVar5 = pCVar5 + 1;
        pCVar7 = pCVar7 + 1;
      } while (pCVar5 != pos);
    }
  }
  else {
    pCVar7 = pCVar4;
    if (pCVar5 != pos) {
      do {
        pCVar7->expr = pCVar5->expr;
        pCVar3 = (pCVar5->syntax).ptr;
        (pCVar7->scope).ptr = (pCVar5->scope).ptr;
        (pCVar7->syntax).ptr = pCVar3;
        pCVar5 = pCVar5 + 1;
        pCVar7 = pCVar7 + 1;
      } while (pCVar5 != pos);
      pCVar5 = this->data_;
      sVar6 = this->len;
    }
    if (pCVar5 + sVar6 != pos) {
      puVar2 = (undefined8 *)((long)pCVar4 + lVar8);
      do {
        puVar2[5] = pos->expr;
        pCVar3 = (pos->syntax).ptr;
        puVar2[3] = (pos->scope).ptr;
        puVar2[4] = pCVar3;
        pos = pos + 1;
        puVar2 = puVar2 + 3;
      } while (pos != pCVar5 + sVar6);
    }
  }
  if (this->data_ != (pointer)this->firstElement) {
    free(this->data_);
  }
  this->len = this->len + 1;
  this->cap = capacity;
  this->data_ = pCVar4;
  return (pointer)((long)pCVar4 + lVar8);
}

Assistant:

typename SmallVectorBase<T>::pointer SmallVectorBase<T>::emplaceRealloc(const pointer pos,
                                                                        Args&&... args) {
    if (len == max_size())
        detail::throwLengthError();

    auto newCap = calculateGrowth(len + 1);
    auto offset = static_cast<size_type>(pos - begin());
    auto newData = (pointer)detail::allocArray(newCap, sizeof(T));

    // First construct the new element in the new memory,
    // so that we don't corrupt the new element if it relied on
    // existing elements we're about to move around.
    auto newPos = newData + offset;
    new (newPos) T(std::forward<Args>(args)...);

    // Now move elements to the new memory.
    if (pos == end()) {
        std::uninitialized_move(begin(), end(), newData);
    }
    else {
        std::uninitialized_move(begin(), pos, newData);
        std::uninitialized_move(pos, end(), newPos + 1);
    }

    cleanup();
    len++;
    cap = newCap;
    data_ = newData;
    return newPos;
}